

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_out_scope.cpp
# Opt level: O0

void __thiscall A::A(A *this,A *other)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  ostream *poVar4;
  int *in_RSI;
  int *in_RDI;
  int j;
  int i;
  scoped_lock l;
  spin_mutex_t *in_stack_ffffffffffffffb8;
  scoped_lock *in_stack_ffffffffffffffc0;
  int local_2c;
  int local_28;
  
  *in_RDI = *in_RSI;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(*in_RSI * *in_RSI);
  uVar2 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pvVar3 = operator_new__(uVar2);
  *(void **)(in_RDI + 2) = pvVar3;
  *(undefined8 *)(in_RDI + 4) = *(undefined8 *)(in_RSI + 4);
  spin_mutex_t::scoped_lock::scoped_lock(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  poVar4 = std::operator<<((ostream *)&std::cerr,"Copying ");
  poVar4 = std::operator<<(poVar4,*(char **)(in_RDI + 4));
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  spin_mutex_t::scoped_lock::~scoped_lock((scoped_lock *)0x125f2e);
  for (local_28 = 0; local_28 < *in_RDI; local_28 = local_28 + 1) {
    for (local_2c = 0; local_2c < *in_RDI; local_2c = local_2c + 1) {
      *(undefined4 *)(*(long *)(in_RDI + 2) + (long)(local_28 * *in_RDI + local_2c) * 4) =
           *(undefined4 *)(*(long *)(in_RSI + 2) + (long)(local_28 * *in_RDI + local_2c) * 4);
    }
  }
  return;
}

Assistant:

A(const A& other) 
  : n_(other.n_), c(new float[other.n_ * other.n_]), name_(other.name_)
  {
    LOG("Copying " << name_);
    for(int i = 0; i < n_; i++)
      for(int j = 0; j < n_; j++) {
	c[i*n_+j] = other.c[i*n_+j];
      }
  }